

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.cc
# Opt level: O0

void absl::lts_20250127::internal_statusor::ThrowBadStatusOrAccess(Status *status)

{
  BadStatusOrAccess *this;
  Status local_18;
  Status *local_10;
  Status *status_local;
  
  local_10 = status;
  this = (BadStatusOrAccess *)__cxa_allocate_exception(0x38);
  Status::Status(&local_18,status);
  BadStatusOrAccess::BadStatusOrAccess(this,&local_18);
  __cxa_throw(this,&BadStatusOrAccess::typeinfo,BadStatusOrAccess::~BadStatusOrAccess);
}

Assistant:

void ThrowBadStatusOrAccess(absl::Status status) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw absl::BadStatusOrAccess(std::move(status));
#else
  ABSL_INTERNAL_LOG(
      FATAL,
      absl::StrCat("Attempting to fetch value instead of handling error ",
                   status.ToString()));
  std::abort();
#endif
}